

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::DerivateUniformSetup::setup
          (DerivateUniformSetup *this,ShaderRenderCaseInstance *instance,Vec4 *param_2)

{
  int iVar1;
  TriangleDerivateCaseInstance *pTVar2;
  float *pfVar3;
  undefined1 local_7c [8];
  DerivateCaseValues values;
  DerivateCaseDefinition definitions;
  Vec4 *param_2_local;
  ShaderRenderCaseInstance *instance_local;
  DerivateUniformSetup *this_local;
  
  pTVar2 = (TriangleDerivateCaseInstance *)
           __dynamic_cast(instance,&ShaderRenderCaseInstance::typeinfo,
                          &sr::(anonymous_namespace)::TriangleDerivateCaseInstance::typeinfo,0);
  if (pTVar2 == (TriangleDerivateCaseInstance *)0x0) {
    __cxa_bad_cast();
  }
  TriangleDerivateCaseInstance::getDerivateCaseDefinition
            ((DerivateCaseDefinition *)(values.derivBias.m_data + 2),pTVar2);
  pTVar2 = (TriangleDerivateCaseInstance *)
           __dynamic_cast(instance,&ShaderRenderCaseInstance::typeinfo,
                          &sr::(anonymous_namespace)::TriangleDerivateCaseInstance::typeinfo,0);
  if (pTVar2 == (TriangleDerivateCaseInstance *)0x0) {
    __cxa_bad_cast();
  }
  TriangleDerivateCaseInstance::getDerivateCaseValues((DerivateCaseValues *)local_7c,pTVar2);
  iVar1 = glu::getDataTypeScalarSize((DataType)values.derivBias.m_data[3]);
  pfVar3 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)(values.coordMax.m_data + 2));
  ShaderRenderCaseInstance::addUniform
            (instance,0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(long)iVar1 << 2,pfVar3);
  iVar1 = glu::getDataTypeScalarSize((DataType)values.derivBias.m_data[3]);
  pfVar3 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)(values.derivScale.m_data + 2));
  ShaderRenderCaseInstance::addUniform
            (instance,1,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(long)iVar1 << 2,pfVar3);
  if ((this->m_useSampler & 1U) != 0) {
    ShaderRenderCaseInstance::useSampler(instance,2,0);
  }
  return;
}

Assistant:

void DerivateUniformSetup::setup (ShaderRenderCaseInstance& instance, const tcu::Vec4&) const
{
	DerivateCaseDefinition	definitions		= dynamic_cast<TriangleDerivateCaseInstance&>(instance).getDerivateCaseDefinition();
	DerivateCaseValues		values			= dynamic_cast<TriangleDerivateCaseInstance&>(instance).getDerivateCaseValues();

	DE_ASSERT(glu::isDataTypeFloatOrVec(definitions.dataType));

	instance.addUniform(0u, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, glu::getDataTypeScalarSize(definitions.dataType) * sizeof(float), values.derivScale.getPtr());
	instance.addUniform(1u, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, glu::getDataTypeScalarSize(definitions.dataType) * sizeof(float), values.derivBias.getPtr());

	if (m_useSampler)
		instance.useSampler(2u, 0u); // To the uniform binding location 2 bind the texture 0
}